

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterTests.cpp
# Opt level: O0

void addMomentum(NeuralNetwork *nn,OptimizerTypeCase optimizerType,double defaultValue,
                double minValue,double maxValue)

{
  NetworkUpdateParameters *this;
  Optimizer *this_00;
  DoubleParameter *this_01;
  DoubleRange *this_02;
  DoubleRange *doubleRange;
  DoubleParameter *momentum;
  SGDOptimizer *realOptimizer;
  Optimizer *optimizer;
  NetworkUpdateParameters *updateParameters;
  double maxValue_local;
  double minValue_local;
  double defaultValue_local;
  OptimizerTypeCase optimizerType_local;
  NeuralNetwork *nn_local;
  
  this = CoreML::Specification::NeuralNetwork::mutable_updateparams(nn);
  this_00 = CoreML::Specification::NetworkUpdateParameters::mutable_optimizer(this);
  momentum = (DoubleParameter *)0x0;
  if (optimizerType == kSgdOptimizer) {
    momentum = (DoubleParameter *)CoreML::Specification::Optimizer::mutable_sgdoptimizer(this_00);
  }
  this_01 = CoreML::Specification::SGDOptimizer::mutable_momentum((SGDOptimizer *)momentum);
  CoreML::Specification::DoubleParameter::set_defaultvalue(this_01,defaultValue);
  this_02 = CoreML::Specification::DoubleParameter::mutable_range(this_01);
  CoreML::Specification::DoubleRange::set_minvalue(this_02,minValue);
  CoreML::Specification::DoubleRange::set_maxvalue(this_02,maxValue);
  return;
}

Assistant:

void addMomentum(Specification::NeuralNetwork *nn, Specification::Optimizer::OptimizerTypeCase optimizerType, double defaultValue, double minValue, double maxValue) {
    
    auto updateParameters = nn->mutable_updateparams();
    auto optimizer = updateParameters->mutable_optimizer();
    auto realOptimizer = (::CoreML::Specification::SGDOptimizer*)NULL;
    
    switch (optimizerType) {
        case Specification::Optimizer::kSgdOptimizer:
            realOptimizer = optimizer->mutable_sgdoptimizer();
            break;
        default:
            break;
    }
    
    auto momentum = realOptimizer->mutable_momentum();
    
    momentum->set_defaultvalue(defaultValue);
    
    auto doubleRange = momentum->mutable_range();
    doubleRange->set_minvalue(minValue);
    doubleRange->set_maxvalue(maxValue);
}